

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void normalizePublicId(XML_Char *publicId)

{
  XML_Char *pXVar1;
  XML_Char *pXVar2;
  XML_Char *pXVar3;
  char cVar4;
  XML_Char *p;
  
  pXVar2 = publicId;
  pXVar3 = publicId;
  do {
    cVar4 = *pXVar3;
    if (((cVar4 == '\n') || (cVar4 == '\r')) || (cVar4 == ' ')) {
      pXVar1 = publicId;
      if ((pXVar2 != publicId) && (cVar4 = ' ', pXVar1 = pXVar2, pXVar2[-1] != ' '))
      goto LAB_0016949f;
    }
    else {
      if (cVar4 == '\0') {
        if ((pXVar2 != publicId) && (publicId = pXVar2 + -1, pXVar2[-1] != ' ')) {
          publicId = pXVar2;
        }
        *publicId = '\0';
        return;
      }
LAB_0016949f:
      *pXVar2 = cVar4;
      pXVar1 = pXVar2 + 1;
    }
    pXVar2 = pXVar1;
    pXVar3 = pXVar3 + 1;
  } while( true );
}

Assistant:

static void FASTCALL
normalizePublicId(XML_Char *publicId) {
  XML_Char *p = publicId;
  XML_Char *s;
  for (s = publicId; *s; s++) {
    switch (*s) {
    case 0x20:
    case 0xD:
    case 0xA:
      if (p != publicId && p[-1] != 0x20)
        *p++ = 0x20;
      break;
    default:
      *p++ = *s;
    }
  }
  if (p != publicId && p[-1] == 0x20)
    --p;
  *p = XML_T('\0');
}